

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_se_decode(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  uint32_t *puVar3;
  bool bVar4;
  internal_state_conflict *state;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  uint32_t uVar10;
  size_t sVar11;
  ulong uVar12;
  
  piVar1 = strm->state;
  uVar5 = piVar1->sample_counter;
  if (uVar5 < strm->block_size) {
    iVar9 = piVar1->bitp;
    do {
      if (iVar9 < 1) {
        sVar11 = strm->avail_in;
        iVar7 = iVar9;
        do {
          sVar11 = sVar11 - 1;
          if (sVar11 == 0xffffffffffffffff) {
            return 0;
          }
          strm->avail_in = sVar11;
          uVar6 = piVar1->acc << 8;
          piVar1->acc = uVar6;
          pbVar2 = strm->next_in;
          strm->next_in = pbVar2 + 1;
          uVar6 = *pbVar2 | uVar6;
          piVar1->acc = uVar6;
          iVar9 = iVar7 + 8;
          piVar1->bitp = iVar9;
          bVar4 = iVar7 < -7;
          iVar7 = iVar9;
        } while (bVar4);
      }
      else {
        uVar6 = piVar1->acc;
      }
      if ((uVar6 >> ((ulong)(byte)((char)iVar9 - 1) & 0x3f) & 1) == 0) {
        do {
          iVar7 = iVar9;
          if (iVar9 == 1) {
            if (strm->avail_in == 0) {
              return 0;
            }
            strm->avail_in = strm->avail_in - 1;
            piVar1->acc = uVar6 << 8;
            pbVar2 = strm->next_in;
            strm->next_in = pbVar2 + 1;
            uVar6 = uVar6 << 8 | (ulong)*pbVar2;
            piVar1->acc = uVar6;
            iVar7 = 9;
          }
          uVar10 = piVar1->fs + 1;
          piVar1->fs = uVar10;
          iVar9 = iVar7 + -1;
          piVar1->bitp = iVar9;
        } while ((uVar6 >> ((ulong)(byte)((char)iVar7 - 2) & 0x3f) & 1) == 0);
      }
      else {
        uVar10 = piVar1->fs;
      }
      if (0x5a < (int)uVar10) {
        return -1;
      }
      uVar8 = uVar10 - piVar1->se_table[(int)(uVar10 * 2 + 1)];
      uVar6 = strm->avail_out;
      uVar12 = (ulong)piVar1->bytes_per_sample;
      if ((uVar5 & 1) == 0) {
        if (uVar6 < uVar12) {
          return 0;
        }
        iVar9 = piVar1->se_table[(int)(uVar10 * 2)];
        puVar3 = piVar1->rsip;
        piVar1->rsip = puVar3 + 1;
        *puVar3 = iVar9 - uVar8;
        uVar12 = (ulong)piVar1->bytes_per_sample;
        uVar6 = uVar6 - uVar12;
        strm->avail_out = uVar6;
        piVar1->sample_counter = piVar1->sample_counter + 1;
      }
      if (uVar6 < uVar12) {
        return 0;
      }
      puVar3 = piVar1->rsip;
      piVar1->rsip = puVar3 + 1;
      *puVar3 = uVar8;
      strm->avail_out = uVar6 - piVar1->bytes_per_sample;
      uVar5 = piVar1->sample_counter + 1;
      piVar1->sample_counter = uVar5;
      piVar1->fs = 0;
      iVar9 = piVar1->bitp + -1;
      piVar1->bitp = iVar9;
    } while (uVar5 < strm->block_size);
  }
  piVar1->mode = m_next_cds;
  return 1;
}

Assistant:

static int m_se_decode(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    while(state->sample_counter < strm->block_size) {
        int32_t m;
        int32_t d1;
        if (fs_ask(strm) == 0)
            return M_EXIT;
        m = state->fs;
        if (m > SE_TABLE_SIZE)
            return M_ERROR;
        d1 = m - state->se_table[2 * m + 1];

        if ((state->sample_counter & 1) == 0) {
            if (strm->avail_out < state->bytes_per_sample)
                return M_EXIT;
            put_sample(strm, state->se_table[2 * m] - d1);
            state->sample_counter++;
        }

        if (strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        put_sample(strm, d1);
        state->sample_counter++;
        fs_drop(strm);
    }

    state->mode = m_next_cds;
    return M_CONTINUE;
}